

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::SeparateProgramsVertex::Run(SeparateProgramsVertex *this)

{
  CallLogWrapper *this_00;
  GLenum *pGVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  uint program;
  uint uVar4;
  mapped_type *pmVar5;
  long error;
  GLenum props [13];
  undefined4 *local_1a8;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined8 local_18c;
  undefined8 uStack_184;
  undefined4 local_17c;
  GLint local_178;
  key_type local_168;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesO;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesU;
  GLint expected3 [6];
  GLenum props3 [6];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesI;
  char *srcVS;
  GLint expected2 [7];
  GLenum props2 [7];
  
  error = 0;
  program = (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              _vptr_GLWrapper[0x17])(this,0x8b31,1);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92e1,0x92f6,2,&error);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92e1,0x92f5,2,&error);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92e3,0x92f6,10,&error);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92e3,0x92f5,1,&error);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92e4,0x92f6,0xc,&error);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92e4,0x92f5,5,&error);
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesU._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesI._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesO._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pGVar1 = props + 4;
  props._0_8_ = pGVar1;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"u","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e1,&indicesU,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"v","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e1,&indicesU,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"in_vertex","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e3,&indicesI,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"r","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e4,&indicesO,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"g","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e4,&indicesO,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"b","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e4,&indicesO,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"iLikePie","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e4,&indicesO,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"gl_Position","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e4,&indicesO,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"u","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)props);
  uVar4 = *pmVar5;
  local_1a8 = &uStack_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"u","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e1,(ulong)uVar4,&local_1a8,&error);
  if (local_1a8 != &uStack_198) {
    operator_delete(local_1a8,CONCAT44(uStack_194,uStack_198) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"v","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)props);
  uVar4 = *pmVar5;
  local_1a8 = &uStack_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"v","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e1,(ulong)uVar4,&local_1a8,&error);
  if (local_1a8 != &uStack_198) {
    operator_delete(local_1a8,CONCAT44(uStack_194,uStack_198) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"in_vertex","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesI,(key_type *)props);
  uVar4 = *pmVar5;
  local_1a8 = &uStack_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"in_vertex","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e3,(ulong)uVar4,&local_1a8,&error);
  if (local_1a8 != &uStack_198) {
    operator_delete(local_1a8,CONCAT44(uStack_194,uStack_198) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"r","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesO,(key_type *)props);
  uVar4 = *pmVar5;
  local_1a8 = &uStack_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"r","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e4,(ulong)uVar4,&local_1a8,&error);
  if (local_1a8 != &uStack_198) {
    operator_delete(local_1a8,CONCAT44(uStack_194,uStack_198) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"g","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesO,(key_type *)props);
  uVar4 = *pmVar5;
  local_1a8 = &uStack_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"g","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e4,(ulong)uVar4,&local_1a8,&error);
  if (local_1a8 != &uStack_198) {
    operator_delete(local_1a8,CONCAT44(uStack_194,uStack_198) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"b","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesO,(key_type *)props);
  uVar4 = *pmVar5;
  local_1a8 = &uStack_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"b","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e4,(ulong)uVar4,&local_1a8,&error);
  if (local_1a8 != &uStack_198) {
    operator_delete(local_1a8,CONCAT44(uStack_194,uStack_198) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"iLikePie","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesO,(key_type *)props);
  uVar4 = *pmVar5;
  local_1a8 = &uStack_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"iLikePie","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e4,(ulong)uVar4,&local_1a8,&error);
  if (local_1a8 != &uStack_198) {
    operator_delete(local_1a8,CONCAT44(uStack_194,uStack_198) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"gl_Position","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesO,(key_type *)props);
  uVar4 = *pmVar5;
  local_1a8 = &uStack_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"gl_Position","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e4,(ulong)uVar4,&local_1a8,&error);
  if (local_1a8 != &uStack_198) {
    operator_delete(local_1a8,CONCAT44(uStack_194,uStack_198) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"u","");
  this_00 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  uVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"u");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,props,(ulong)uVar4,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"v","");
  uVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"v");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,props,(ulong)uVar4,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"in_vertex","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e3,props,0,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props[8] = 0x9301;
  props[9] = 0x930b;
  props[10] = 0x930a;
  props[0xb] = 0x9306;
  props[4] = 0x92fd;
  props[5] = 0x92fe;
  props[6] = 0x92ff;
  props[7] = 0x9300;
  props[0] = 0x92f9;
  props[1] = 0x92fa;
  props[2] = 0x92fb;
  props[3] = 0x92fc;
  props[0xc] = 0x930e;
  local_1a8 = (undefined4 *)0x8b5200000002;
  local_1a0 = 1;
  local_19c = 0xffffffff;
  uStack_198 = 0xffffffff;
  uStack_194 = 0xffffffff;
  uStack_190 = 0xffffffff;
  local_18c = 0xffffffff00000000;
  uStack_184 = 0;
  local_17c = 1;
  local_178 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"v");
  paVar2 = &local_168.field_2;
  local_168._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"v","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,&local_168);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e1,(ulong)*pmVar5,0xd,props,0xd,&local_1a8,&error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  props2[4] = 0x930a;
  props2[5] = 0x9306;
  props2[6] = 0x930e;
  props2[0] = 0x92f9;
  props2[1] = 0x92fa;
  props2[2] = 0x92fb;
  props2[3] = 0x930b;
  expected2[4] = 0;
  expected2[5] = 1;
  expected2[6] = 0;
  expected2[0] = 10;
  expected2[1] = 0x8b52;
  expected2[2] = 1;
  expected2[3] = 0;
  local_168._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"in_vertex","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesI,&local_168);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e3,(ulong)*pmVar5,7,props2,7,expected2,&error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  props3[0] = 0x92f9;
  props3[1] = 0x92fa;
  props3[2] = 0x92fb;
  props3[3] = 0x930b;
  props3[4] = 0x930a;
  props3[5] = 0x9306;
  expected3[0] = 9;
  expected3[1] = 0x8b52;
  expected3[2] = 1;
  expected3[3] = 0;
  expected3[4] = 0;
  expected3[5] = 1;
  local_168._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"iLikePie","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesO,&local_168);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e4,(ulong)*pmVar5,6,props3,6,expected3,&error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  lVar3 = error;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesO._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesI._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesU._M_t);
  return lVar3;
}

Assistant:

virtual long Run()
	{
		long error = NO_ERROR;

		const char* srcVS = "#version 310 es                            \n"
							"layout(location = 0) in vec4 in_vertex;    \n"
							""
							"out mediump float r, g, b;                           \n"
							"out mediump vec4 iLikePie;                           \n"
							""
							"uniform mediump float u;                           \n"
							"uniform mediump vec4 v;                            \n"
							""
							"void main() {                     \n"
							"  gl_Position = in_vertex;        \n"
							"  r = u;                          \n"
							"  g = 0.0;                        \n"
							"  b = 0.0;                        \n"
							"  iLikePie = v;                   \n"
							"}";

		const GLuint vs = CreateShaderProgram(GL_VERTEX_SHADER, 1, &srcVS);

		VerifyGetProgramInterfaceiv(vs, GL_UNIFORM, GL_MAX_NAME_LENGTH, 2, error);
		VerifyGetProgramInterfaceiv(vs, GL_UNIFORM, GL_ACTIVE_RESOURCES, 2, error);
		VerifyGetProgramInterfaceiv(vs, GL_PROGRAM_INPUT, GL_MAX_NAME_LENGTH, 10, error);
		VerifyGetProgramInterfaceiv(vs, GL_PROGRAM_INPUT, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(vs, GL_PROGRAM_OUTPUT, GL_MAX_NAME_LENGTH, 12, error);
		VerifyGetProgramInterfaceiv(vs, GL_PROGRAM_OUTPUT, GL_ACTIVE_RESOURCES, 5, error);

		std::map<std::string, GLuint> indicesU;
		std::map<std::string, GLuint> indicesI;
		std::map<std::string, GLuint> indicesO;
		VerifyGetProgramResourceIndex(vs, GL_UNIFORM, indicesU, "u", error);
		VerifyGetProgramResourceIndex(vs, GL_UNIFORM, indicesU, "v", error);
		VerifyGetProgramResourceIndex(vs, GL_PROGRAM_INPUT, indicesI, "in_vertex", error);
		VerifyGetProgramResourceIndex(vs, GL_PROGRAM_OUTPUT, indicesO, "r", error);
		VerifyGetProgramResourceIndex(vs, GL_PROGRAM_OUTPUT, indicesO, "g", error);
		VerifyGetProgramResourceIndex(vs, GL_PROGRAM_OUTPUT, indicesO, "b", error);
		VerifyGetProgramResourceIndex(vs, GL_PROGRAM_OUTPUT, indicesO, "iLikePie", error);
		VerifyGetProgramResourceIndex(vs, GL_PROGRAM_OUTPUT, indicesO, "gl_Position", error);

		VerifyGetProgramResourceName(vs, GL_UNIFORM, indicesU["u"], "u", error);
		VerifyGetProgramResourceName(vs, GL_UNIFORM, indicesU["v"], "v", error);
		VerifyGetProgramResourceName(vs, GL_PROGRAM_INPUT, indicesI["in_vertex"], "in_vertex", error);
		VerifyGetProgramResourceName(vs, GL_PROGRAM_OUTPUT, indicesO["r"], "r", error);
		VerifyGetProgramResourceName(vs, GL_PROGRAM_OUTPUT, indicesO["g"], "g", error);
		VerifyGetProgramResourceName(vs, GL_PROGRAM_OUTPUT, indicesO["b"], "b", error);
		VerifyGetProgramResourceName(vs, GL_PROGRAM_OUTPUT, indicesO["iLikePie"], "iLikePie", error);
		VerifyGetProgramResourceName(vs, GL_PROGRAM_OUTPUT, indicesO["gl_Position"], "gl_Position", error);

		VerifyGetProgramResourceLocation(vs, GL_UNIFORM, "u", glGetUniformLocation(vs, "u"), error);
		VerifyGetProgramResourceLocation(vs, GL_UNIFORM, "v", glGetUniformLocation(vs, "v"), error);
		VerifyGetProgramResourceLocation(vs, GL_PROGRAM_INPUT, "in_vertex", 0, error);

		GLenum props[] = { GL_NAME_LENGTH,
						   GL_TYPE,
						   GL_ARRAY_SIZE,
						   GL_OFFSET,
						   GL_BLOCK_INDEX,
						   GL_ARRAY_STRIDE,
						   GL_MATRIX_STRIDE,
						   GL_IS_ROW_MAJOR,
						   GL_ATOMIC_COUNTER_BUFFER_INDEX,
						   GL_REFERENCED_BY_COMPUTE_SHADER,
						   GL_REFERENCED_BY_FRAGMENT_SHADER,
						   GL_REFERENCED_BY_VERTEX_SHADER,
						   GL_LOCATION };
		GLint expected[] = { 2, 35666, 1, -1, -1, -1, -1, 0, -1, 0, 0, 1, glGetUniformLocation(vs, "v") };
		VerifyGetProgramResourceiv(vs, GL_UNIFORM, indicesU["v"], 13, props, 13, expected, error);

		GLenum props2[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_LOCATION };
		GLint expected2[] = { 10, 35666, 1, 0, 0, 1, 0 };
		VerifyGetProgramResourceiv(vs, GL_PROGRAM_INPUT, indicesI["in_vertex"], 7, props2, 7, expected2, error);

		GLenum props3[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER };
		GLint expected3[] = { 9, 35666, 1, 0, 0, 1 };
		VerifyGetProgramResourceiv(vs, GL_PROGRAM_OUTPUT, indicesO["iLikePie"], 6, props3, 6, expected3, error);

		glDeleteProgram(vs);
		return error;
	}